

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_order(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  uv__queue *puVar3;
  undefined4 *unaff_RBX;
  uv_loop_t *puVar4;
  long *plVar5;
  code **ppcVar6;
  uv_timer_t *puVar7;
  int64_t eval_b;
  int64_t eval_b_1;
  int second;
  int first;
  uv_timer_t handle_b;
  uv_timer_t handle_a;
  undefined1 auStack_2b8 [120];
  uv_loop_t *puStack_240;
  code *pcStack_238;
  void *pvStack_230;
  undefined1 auStack_228 [16];
  undefined8 uStack_218;
  uv__queue *puStack_210;
  undefined1 auStack_208 [24];
  uv_close_cb p_Stack_1f0;
  uv__queue *puStack_1e8;
  undefined8 uStack_1d8;
  undefined1 auStack_1d0 [176];
  code *pcStack_120;
  long local_118;
  long local_110;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 *local_100 [15];
  undefined4 *local_88 [15];
  
  plVar5 = &local_118;
  local_104 = 0;
  local_108 = 1;
  pcStack_120 = (code *)0x1d6a9c;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x1d6aac;
  iVar1 = uv_timer_init(uVar2,local_88);
  local_100[0] = (undefined4 *)(long)iVar1;
  local_118 = 0;
  if (local_100[0] == (undefined4 *)0x0) {
    pcStack_120 = (code *)0x1d6acf;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d6adc;
    iVar1 = uv_timer_init(uVar2,local_100);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6d4c;
    unaff_RBX = &local_104;
    pcStack_120 = (code *)0x1d6b1a;
    local_88[0] = unaff_RBX;
    iVar1 = uv_timer_start(local_88,order_cb_a,0,0);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6d59;
    pcStack_120 = (code *)0x1d6b55;
    local_100[0] = &local_108;
    iVar1 = uv_timer_start(local_100,order_cb_b,0,0);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6d66;
    pcStack_120 = (code *)0x1d6b78;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d6b82;
    iVar1 = uv_run(uVar2,0);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6d73;
    local_118 = 2;
    local_110 = (long)order_cb_called;
    if (local_110 != 2) goto LAB_001d6d80;
    pcStack_120 = (code *)0x1d6bd0;
    iVar1 = uv_timer_stop(local_88);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6d8d;
    pcStack_120 = (code *)0x1d6bf8;
    iVar1 = uv_timer_stop(local_100);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6d9a;
    order_cb_called = 0;
    pcStack_120 = (code *)0x1d6c38;
    local_100[0] = unaff_RBX;
    iVar1 = uv_timer_start(local_100,order_cb_b,0,0);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6da7;
    pcStack_120 = (code *)0x1d6c71;
    local_88[0] = &local_108;
    iVar1 = uv_timer_start(local_88,order_cb_a,0,0);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6db4;
    pcStack_120 = (code *)0x1d6c94;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d6c9e;
    iVar1 = uv_run(uVar2,0);
    local_118 = (long)iVar1;
    local_110 = 0;
    if (local_118 != 0) goto LAB_001d6dc1;
    local_118 = 2;
    local_110 = (long)order_cb_called;
    if (local_110 != 2) goto LAB_001d6dce;
    pcStack_120 = (code *)0x1d6ce4;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_120 = (code *)0x1d6cf8;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_120 = (code *)0x1d6d02;
    uv_run(unaff_RBX,0);
    local_118 = 0;
    pcStack_120 = (code *)0x1d6d0f;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x1d6d17;
    iVar1 = uv_loop_close(uVar2);
    local_110 = (long)iVar1;
    if (local_118 == local_110) {
      pcStack_120 = (code *)0x1d6d32;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1d6d4c;
    run_test_timer_order_cold_1();
LAB_001d6d4c:
    pcStack_120 = (code *)0x1d6d59;
    run_test_timer_order_cold_2();
LAB_001d6d59:
    pcStack_120 = (code *)0x1d6d66;
    run_test_timer_order_cold_3();
LAB_001d6d66:
    pcStack_120 = (code *)0x1d6d73;
    run_test_timer_order_cold_4();
LAB_001d6d73:
    pcStack_120 = (code *)0x1d6d80;
    run_test_timer_order_cold_5();
LAB_001d6d80:
    pcStack_120 = (code *)0x1d6d8d;
    run_test_timer_order_cold_6();
LAB_001d6d8d:
    pcStack_120 = (code *)0x1d6d9a;
    run_test_timer_order_cold_7();
LAB_001d6d9a:
    pcStack_120 = (code *)0x1d6da7;
    run_test_timer_order_cold_8();
LAB_001d6da7:
    pcStack_120 = (code *)0x1d6db4;
    run_test_timer_order_cold_9();
LAB_001d6db4:
    pcStack_120 = (code *)0x1d6dc1;
    run_test_timer_order_cold_10();
LAB_001d6dc1:
    pcStack_120 = (code *)0x1d6dce;
    run_test_timer_order_cold_11();
LAB_001d6dce:
    pcStack_120 = (code *)0x1d6ddb;
    run_test_timer_order_cold_12();
  }
  pcStack_120 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_120 = (code *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  auStack_1d0._168_8_ = SEXT48(*(int *)*plVar5);
  if (pcStack_120 == (code *)auStack_1d0._168_8_) {
    return iVar1;
  }
  ppcVar6 = &pcStack_120;
  auStack_1d0._152_8_ = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  auStack_1d0._152_8_ = SEXT48(order_cb_called);
  order_cb_called = order_cb_called + 1;
  auStack_1d0._144_8_ = SEXT48(*(int *)*ppcVar6);
  if (auStack_1d0._152_8_ == auStack_1d0._144_8_) {
    return iVar1;
  }
  auStack_1d0._128_8_ = run_test_timer_zero_timeout;
  order_cb_b_cold_1();
  puStack_1e8 = (uv__queue *)0x1d6e7d;
  auStack_1d0._128_8_ = unaff_RBX;
  puVar3 = (uv__queue *)uv_default_loop();
  puStack_1e8 = (uv__queue *)0x1d6e8d;
  iVar1 = uv_timer_init(puVar3,auStack_1d0 + 8);
  auStack_1d0._0_8_ = SEXT48(iVar1);
  uStack_1d8 = (uv_handle_t *)0x0;
  if ((uv_handle_t *)auStack_1d0._0_8_ == (uv_handle_t *)0x0) {
    puStack_1e8 = (uv__queue *)0x1d6ec2;
    iVar1 = uv_timer_start(auStack_1d0 + 8,zero_timeout_cb,0,0);
    auStack_1d0._0_8_ = SEXT48(iVar1);
    uStack_1d8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_1d0._0_8_ != (uv_handle_t *)0x0) goto LAB_001d6fea;
    auStack_1d0._0_8_ = (uv_handle_t *)0x1;
    puStack_1e8 = (uv__queue *)0x1d6ef5;
    iVar1 = uv_run(puVar3,0);
    uStack_1d8 = SEXT48(iVar1);
    if (auStack_1d0._0_8_ != uStack_1d8) goto LAB_001d6ff9;
    auStack_1d0._0_8_ = (uv_handle_t *)0x1;
    uStack_1d8 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_1d8 != (uv_handle_t *)0x1) goto LAB_001d7008;
    puStack_1e8 = (uv__queue *)0x1d6f3d;
    uv_close(auStack_1d0 + 8,0);
    puStack_1e8 = (uv__queue *)0x1d6f47;
    iVar1 = uv_run(puVar3,0);
    auStack_1d0._0_8_ = SEXT48(iVar1);
    uStack_1d8 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_1d0._0_8_ != (uv_handle_t *)0x0) goto LAB_001d7017;
    auStack_1d0._0_8_ = (uv_handle_t *)0x1;
    uStack_1d8 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_1d8 != (uv_handle_t *)0x1) goto LAB_001d7026;
    puStack_1e8 = (uv__queue *)0x1d6f9d;
    uv_walk(puVar3,close_walk_cb,0);
    puStack_1e8 = (uv__queue *)0x1d6fa7;
    uv_run(puVar3,0);
    auStack_1d0._0_8_ = (uv_handle_t *)0x0;
    puStack_1e8 = (uv__queue *)0x1d6fb8;
    iVar1 = uv_loop_close(puVar3);
    uStack_1d8 = SEXT48(iVar1);
    if (auStack_1d0._0_8_ == uStack_1d8) {
      puStack_1e8 = (uv__queue *)0x1d6fd0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_1e8 = (uv__queue *)0x1d6fea;
    run_test_timer_zero_timeout_cold_1();
LAB_001d6fea:
    puStack_1e8 = (uv__queue *)0x1d6ff9;
    run_test_timer_zero_timeout_cold_2();
LAB_001d6ff9:
    puStack_1e8 = (uv__queue *)0x1d7008;
    run_test_timer_zero_timeout_cold_3();
LAB_001d7008:
    puStack_1e8 = (uv__queue *)0x1d7017;
    run_test_timer_zero_timeout_cold_4();
LAB_001d7017:
    puStack_1e8 = (uv__queue *)0x1d7026;
    run_test_timer_zero_timeout_cold_5();
LAB_001d7026:
    puStack_1e8 = (uv__queue *)0x1d7035;
    run_test_timer_zero_timeout_cold_6();
  }
  puVar4 = (uv_loop_t *)auStack_1d0;
  puStack_1e8 = (uv__queue *)zero_timeout_cb;
  run_test_timer_zero_timeout_cold_7();
  auStack_208._8_8_ = (uv_loop_t *)0x1d705c;
  puStack_1e8 = puVar3;
  iVar1 = uv_timer_start();
  p_Stack_1f0 = (uv_close_cb)(long)iVar1;
  auStack_208._16_8_ = (uv_handle_t *)0x0;
  if (p_Stack_1f0 == (uv_close_cb)0x0) {
    auStack_208._8_8_ = (uv_loop_t *)0x1d707f;
    iVar1 = uv_stop(*(undefined8 *)&puVar4->active_handles);
    zero_timeout_cb_calls = zero_timeout_cb_calls + 1;
    return iVar1;
  }
  auStack_208._8_8_ = run_test_timer_huge_timeout;
  zero_timeout_cb_cold_1();
  uStack_218._0_4_ = 0x1d70a2;
  uStack_218._4_4_ = 0;
  auStack_208._8_8_ = puVar4;
  uVar2 = uv_default_loop();
  uStack_218._0_4_ = 0x1d70b1;
  uStack_218._4_4_ = 0;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_208._0_8_ = SEXT48(iVar1);
  puStack_210 = (uv__queue *)0x0;
  if ((uv__queue *)auStack_208._0_8_ == (uv__queue *)0x0) {
    uStack_218._0_4_ = 0x1d70d4;
    uStack_218._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d70e3;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d72ee;
    uStack_218._0_4_ = 0x1d7106;
    uStack_218._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d7115;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer2);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d72fb;
    uStack_218._0_4_ = 0x1d714d;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d7308;
    puVar4 = (uv_loop_t *)0xffffffffffff;
    uStack_218._0_4_ = 0x1d718d;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d7315;
    uStack_218._0_4_ = 0x1d71c7;
    uStack_218._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d7322;
    auStack_208._0_8_ = (uv__queue *)0x1;
    uStack_218._0_4_ = 0x1d71fa;
    uStack_218._4_4_ = 0;
    puStack_210 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if ((uv__queue *)auStack_208._0_8_ != puStack_210) goto LAB_001d732f;
    auStack_208._0_8_ = (uv__queue *)0xffffffffffff;
    uStack_218._0_4_ = 0x1d721e;
    uStack_218._4_4_ = 0;
    puStack_210 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if ((uv__queue *)auStack_208._0_8_ != puStack_210) goto LAB_001d733c;
    auStack_208._0_8_ = (uv__queue *)0x0;
    uStack_218._0_4_ = 0x1d7246;
    uStack_218._4_4_ = 0;
    puStack_210 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (puStack_210 < (ulong)auStack_208._0_8_) goto LAB_001d7349;
    uStack_218._0_4_ = 0x1d725e;
    uStack_218._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d7268;
    uStack_218._4_4_ = 0;
    iVar1 = uv_run(uVar2,0);
    auStack_208._0_8_ = SEXT48(iVar1);
    puStack_210 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_208._0_8_ != (uv__queue *)0x0) goto LAB_001d7356;
    uStack_218._0_4_ = 0x1d728b;
    uStack_218._4_4_ = 0;
    puVar4 = (uv_loop_t *)uv_default_loop();
    uStack_218._0_4_ = 0x1d729f;
    uStack_218._4_4_ = 0;
    uv_walk(puVar4,close_walk_cb,0);
    uStack_218._0_4_ = 0x1d72a9;
    uStack_218._4_4_ = 0;
    uv_run(puVar4,0);
    auStack_208._0_8_ = (uv__queue *)0x0;
    uStack_218._0_4_ = 0x1d72b7;
    uStack_218._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_218._0_4_ = 0x1d72bf;
    uStack_218._4_4_ = 0;
    iVar1 = uv_loop_close(uVar2);
    puStack_210 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)auStack_208._0_8_ == puStack_210) {
      uStack_218._0_4_ = 0x1d72d9;
      uStack_218._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_218._0_4_ = 0x1d72ee;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d72ee:
    uStack_218._0_4_ = 0x1d72fb;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d72fb:
    uStack_218._0_4_ = 0x1d7308;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d7308:
    uStack_218._0_4_ = 0x1d7315;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d7315:
    uStack_218._0_4_ = 0x1d7322;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d7322:
    uStack_218._0_4_ = 0x1d732f;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d732f:
    uStack_218._0_4_ = 0x1d733c;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d733c:
    uStack_218._0_4_ = 0x1d7349;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d7349:
    uStack_218._0_4_ = 0x1d7356;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d7356:
    uStack_218._0_4_ = 0x1d7363;
    uStack_218._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar7 = (uv_timer_t *)auStack_208;
  uStack_218 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar7 == &tiny_timer) {
    auStack_228._8_8_ = (uv_loop_t *)0x1d738b;
    uv_close(&tiny_timer,0);
    auStack_228._8_8_ = (uv_loop_t *)0x1d7399;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  auStack_228._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_238 = (code *)0x1d73b7;
  auStack_228._8_8_ = puVar4;
  uVar2 = uv_default_loop();
  pcStack_238 = (code *)0x1d73c6;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_228._0_8_ = SEXT48(iVar1);
  pvStack_230 = (void *)0x0;
  if ((void *)auStack_228._0_8_ == (void *)0x0) {
    pcStack_238 = (code *)0x1d73e9;
    uVar2 = uv_default_loop();
    pcStack_238 = (code *)0x1d73f8;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d751f;
    pcStack_238 = (code *)0x1d7433;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d752c;
    pcStack_238 = (code *)0x1d7470;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d7539;
    pcStack_238 = (code *)0x1d7493;
    uVar2 = uv_default_loop();
    pcStack_238 = (code *)0x1d749d;
    iVar1 = uv_run(uVar2,0);
    auStack_228._0_8_ = SEXT48(iVar1);
    pvStack_230 = (void *)0x0;
    if ((void *)auStack_228._0_8_ != (void *)0x0) goto LAB_001d7546;
    pcStack_238 = (code *)0x1d74c0;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_238 = (code *)0x1d74d4;
    uv_walk(puVar4,close_walk_cb,0);
    pcStack_238 = (code *)0x1d74de;
    uv_run(puVar4,0);
    auStack_228._0_8_ = (void *)0x0;
    pcStack_238 = (code *)0x1d74ec;
    uVar2 = uv_default_loop();
    pcStack_238 = (code *)0x1d74f4;
    iVar1 = uv_loop_close(uVar2);
    pvStack_230 = (void *)(long)iVar1;
    if ((void *)auStack_228._0_8_ == pvStack_230) {
      pcStack_238 = (code *)0x1d750a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_238 = (code *)0x1d751f;
    run_test_timer_huge_repeat_cold_1();
LAB_001d751f:
    pcStack_238 = (code *)0x1d752c;
    run_test_timer_huge_repeat_cold_2();
LAB_001d752c:
    pcStack_238 = (code *)0x1d7539;
    run_test_timer_huge_repeat_cold_3();
LAB_001d7539:
    pcStack_238 = (code *)0x1d7546;
    run_test_timer_huge_repeat_cold_4();
LAB_001d7546:
    pcStack_238 = (code *)0x1d7553;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar7 = (uv_timer_t *)auStack_228;
  pcStack_238 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar7 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX;
    }
  }
  else {
    if (puVar7 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX;
      }
      puStack_240 = (uv_loop_t *)0x1d7592;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    puStack_240 = (uv_loop_t *)0x1d75be;
    huge_repeat_cb_cold_1();
  }
  puStack_240 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_240 = puVar4;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_2b8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_2b8,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d77c3;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d77d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d77e1;
    iVar1 = uv_timer_start(auStack_2b8,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d77f0;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d77ff;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d780e;
    uv_close(auStack_2b8,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d782c;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d77c3:
    run_test_timer_run_once_cold_2();
LAB_001d77d2:
    run_test_timer_run_once_cold_3();
LAB_001d77e1:
    run_test_timer_run_once_cold_4();
LAB_001d77f0:
    run_test_timer_run_once_cold_5();
LAB_001d77ff:
    run_test_timer_run_once_cold_6();
LAB_001d780e:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d782c:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(timer_order) {
  int first;
  int second;
  uv_timer_t handle_a;
  uv_timer_t handle_b;

  first = 0;
  second = 1;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle_a));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &handle_b));

  /* Test for starting handle_a then handle_b */
  handle_a.data = &first;
  ASSERT_OK(uv_timer_start(&handle_a, order_cb_a, 0, 0));
  handle_b.data = &second;
  ASSERT_OK(uv_timer_start(&handle_b, order_cb_b, 0, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, order_cb_called);

  ASSERT_OK(uv_timer_stop(&handle_a));
  ASSERT_OK(uv_timer_stop(&handle_b));

  /* Test for starting handle_b then handle_a */
  order_cb_called = 0;
  handle_b.data = &first;
  ASSERT_OK(uv_timer_start(&handle_b, order_cb_b, 0, 0));

  handle_a.data = &second;
  ASSERT_OK(uv_timer_start(&handle_a, order_cb_a, 0, 0));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, order_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}